

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createCompositeCompare
          (Builder *this,Decoration precision,Id value1,Id value2,bool equal)

{
  bool bVar1;
  Id typeId;
  Id IVar2;
  uint size;
  Id IVar3;
  Op OVar4;
  Op opCode;
  bool local_8d;
  Id subResultId;
  Id constituent2;
  Id constituent1;
  Id constituentType2;
  Id constituentType1;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  int constituent;
  Op op;
  int numConstituents;
  Id resultId;
  Id valueType;
  Id boolType;
  bool equal_local;
  Id value2_local;
  Id value1_local;
  Decoration precision_local;
  Builder *this_local;
  
  typeId = makeBoolType(this);
  IVar2 = getTypeId(this,value1);
  op = OpNop;
  size = getNumTypeConstituents(this,IVar2);
  bVar1 = isScalarType(this,IVar2);
  if ((bVar1) || (bVar1 = isVectorType(this,IVar2), bVar1)) {
    IVar3 = getTypeId(this,value2);
    if (IVar2 != IVar3) {
      __assert_fail("valueType == getTypeId(value2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xd4c,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
    }
    OVar4 = getMostBasicTypeClass(this,IVar2);
    if (OVar4 == OpTypeBool) {
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = OpLogicalNotEqual;
      if (equal) {
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = OpLogicalEqual;
      }
      value2_local = 0x7fffffff;
    }
    else {
      value2_local = precision;
      if ((OVar4 == OpTypeInt) || (OVar4 != OpTypeFloat)) {
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = OpINotEqual;
        if (equal) {
          indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = OpIEqual;
        }
      }
      else {
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = OpFUnordNotEqual;
        if (equal) {
          indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = OpFOrdEqual;
        }
      }
    }
    bVar1 = isScalarType(this,IVar2);
    OVar4 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    if (bVar1) {
      op = createBinOp(this,indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,typeId,value1,
                       value2);
    }
    else {
      IVar2 = makeVectorType(this,typeId,size);
      IVar2 = createBinOp(this,OVar4,IVar2,value1,value2);
      setPrecision(this,IVar2,value2_local);
      OVar4 = OpAny;
      if (equal) {
        OVar4 = OpAll;
      }
      op = createUnaryOp(this,OVar4,typeId,IVar2);
    }
    this_local._4_4_ = setPrecision(this,op,value2_local);
  }
  else {
    bVar1 = isAggregateType(this,IVar2);
    local_8d = true;
    if (!bVar1) {
      local_8d = isMatrixType(this,IVar2);
    }
    if (local_8d == false) {
      __assert_fail("isAggregateType(valueType) || isMatrixType(valueType)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xd6e,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
    }
    for (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)(Id)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < (int)size;
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (Id)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1) {
      constituentType1 =
           (Id)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      std::allocator<unsigned_int>::allocator
                ((allocator<unsigned_int> *)((long)&constituentType2 + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,1,&constituentType1
                 ,(allocator_type *)((long)&constituentType2 + 3));
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)((long)&constituentType2 + 3));
      IVar2 = getTypeId(this,value1);
      IVar2 = getContainedTypeId(this,IVar2,
                                 (Id)indexes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      IVar3 = getTypeId(this,value2);
      IVar3 = getContainedTypeId(this,IVar3,
                                 (Id)indexes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      IVar2 = createCompositeExtract
                        (this,value1,IVar2,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      IVar3 = createCompositeExtract
                        (this,value2,IVar3,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      OVar4 = createCompositeCompare(this,precision,IVar2,IVar3,equal);
      if ((Id)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != 0) {
        opCode = OpLogicalOr;
        if (equal) {
          opCode = OpLogicalAnd;
        }
        IVar2 = createBinOp(this,opCode,typeId,op,OVar4);
        OVar4 = setPrecision(this,IVar2,precision);
      }
      op = OVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    }
    this_local._4_4_ = op;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createCompositeCompare(Decoration precision, Id value1, Id value2, bool equal)
{
    Id boolType = makeBoolType();
    Id valueType = getTypeId(value1);

    Id resultId = NoResult;

    int numConstituents = getNumTypeConstituents(valueType);

    // Scalars and Vectors

    if (isScalarType(valueType) || isVectorType(valueType)) {
        assert(valueType == getTypeId(value2));
        // These just need a single comparison, just have
        // to figure out what it is.
        Op op;
        switch (getMostBasicTypeClass(valueType)) {
        case OpTypeFloat:
            op = equal ? OpFOrdEqual : OpFUnordNotEqual;
            break;
        case OpTypeInt:
        default:
            op = equal ? OpIEqual : OpINotEqual;
            break;
        case OpTypeBool:
            op = equal ? OpLogicalEqual : OpLogicalNotEqual;
            precision = NoPrecision;
            break;
        }

        if (isScalarType(valueType)) {
            // scalar
            resultId = createBinOp(op, boolType, value1, value2);
        } else {
            // vector
            resultId = createBinOp(op, makeVectorType(boolType, numConstituents), value1, value2);
            setPrecision(resultId, precision);
            // reduce vector compares...
            resultId = createUnaryOp(equal ? OpAll : OpAny, boolType, resultId);
        }

        return setPrecision(resultId, precision);
    }

    // Only structs, arrays, and matrices should be left.
    // They share in common the reduction operation across their constituents.
    assert(isAggregateType(valueType) || isMatrixType(valueType));

    // Compare each pair of constituents
    for (int constituent = 0; constituent < numConstituents; ++constituent) {
        std::vector<unsigned> indexes(1, constituent);
        Id constituentType1 = getContainedTypeId(getTypeId(value1), constituent);
        Id constituentType2 = getContainedTypeId(getTypeId(value2), constituent);
        Id constituent1 = createCompositeExtract(value1, constituentType1, indexes);
        Id constituent2 = createCompositeExtract(value2, constituentType2, indexes);

        Id subResultId = createCompositeCompare(precision, constituent1, constituent2, equal);

        if (constituent == 0)
            resultId = subResultId;
        else
            resultId = setPrecision(createBinOp(equal ? OpLogicalAnd : OpLogicalOr, boolType, resultId, subResultId),
                                    precision);
    }

    return resultId;
}